

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

optional<int> slang::strToInt(string_view str,size_t *pos,int base)

{
  optional<int> *this;
  int *piVar1;
  const_pointer pvVar2;
  undefined4 in_ECX;
  long *in_RDX;
  __integer_from_chars_result_type<int> _Var3;
  __integer_from_chars_result_type<int> result;
  int32_t value;
  int *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc8;
  int __base;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  _Optional_payload_base<int> local_8;
  
  __base = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  this = (optional<int> *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  _Var3 = std::from_chars<int>
                    ((char *)in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                     (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__base);
  piVar1 = (int *)_Var3.ptr;
  if (_Var3.ec == 0) {
    if (in_RDX != (long *)0x0) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
      *in_RDX = (long)piVar1 - (long)pvVar2;
      in_stack_ffffffffffffffa8 = piVar1;
    }
    std::optional<int>::optional<int,_true>(this,in_stack_ffffffffffffffa8);
  }
  else {
    std::optional<int>::optional((optional<int> *)&local_8);
  }
  return (optional<int>)local_8;
}

Assistant:

std::optional<int32_t> strToInt(std::string_view str, size_t* pos, int base) {
    int32_t value;
    auto result = std::from_chars(str.data(), str.data() + str.size(), value, base);
    if (result.ec != std::errc())
        return std::nullopt;

    if (pos)
        *pos = size_t(result.ptr - str.data());
    return value;
}